

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O0

bool __thiscall
EnrichableAnalyzerSubprocess::GetFeatureEnablement(EnrichableAnalyzerSubprocess *this,char *feature)

{
  uint outBufferLength;
  int iVar1;
  char *outBuffer;
  string local_208 [48];
  string local_1d8 [8];
  string value;
  char local_1b8 [8];
  char result [16];
  stringstream outputStream;
  ostream local_198 [376];
  char *local_20;
  char *feature_local;
  EnrichableAnalyzerSubprocess *this_local;
  
  local_20 = feature;
  feature_local = (char *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)(result + 8));
  std::__cxx11::string::string(local_1d8);
  std::operator<<(local_198,"feature");
  std::operator<<(local_198,'\t');
  std::operator<<(local_198,local_20);
  std::operator<<(local_198,'\n');
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_1d8,local_208);
  std::__cxx11::string::~string(local_208);
  outBuffer = (char *)std::__cxx11::string::c_str();
  outBufferLength = std::__cxx11::string::length();
  GetScriptResponse(this,outBuffer,outBufferLength,local_1b8,0x10);
  iVar1 = strcmp(local_1b8,"no");
  this_local._7_1_ = iVar1 != 0;
  if (!(bool)this_local._7_1_) {
    std::operator<<((ostream *)&std::cerr,"message type \"");
    std::operator<<((ostream *)&std::cerr,local_20);
    std::operator<<((ostream *)&std::cerr,"\" disabled\n");
  }
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(result + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool EnrichableAnalyzerSubprocess::GetFeatureEnablement(const char* feature) {
	std::stringstream outputStream;
	char result[16];
	std::string value;

	outputStream << FEATURE_PREFIX;
	outputStream << UNIT_SEPARATOR;
	outputStream << feature;
	outputStream << LINE_SEPARATOR;
	value = outputStream.str();

	GetScriptResponse(
		value.c_str(),
		value.length(),
		result,
		16
	);
	if(strcmp(result, "no") == 0) {
		std::cerr << "message type \"";
		std::cerr << feature;
		std::cerr << "\" disabled\n";
		return false;
	}
	return true;
}